

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTreeInterfaces.cpp
# Opt level: O3

bool __thiscall
Indexing::CodeTreeTIS<Indexing::DemodulatorData>::ResultIterator::hasNext(ResultIterator *this)

{
  DemodulatorData *pDVar1;
  bool bVar2;
  
  if (this->_found != (DemodulatorData *)0x0) {
    return true;
  }
  if (this->_finished == false) {
    pDVar1 = TermCodeTree<Indexing::DemodulatorData>::TermMatcher::next
                       ((this->_matcher)._self._M_t.
                        super___uniq_ptr_impl<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher_*,_std::default_delete<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher>_>
                        .
                        super__Head_base<0UL,_Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher_*,_false>
                        ._M_head_impl);
    this->_found = pDVar1;
    if (pDVar1 == (DemodulatorData *)0x0) {
      this->_finished = true;
    }
    bVar2 = pDVar1 != (DemodulatorData *)0x0;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool hasNext()
  {
    if(_found) {
      return true;
    }
    if(_finished) {
      return false;
    }
    _found = _matcher->next();
    if(!_found) {
      _finished=true;
    }
    return _found;
  }